

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O1

bool __thiscall
Clasp::DefaultUnfoundedCheck::propagateFixpoint
          (DefaultUnfoundedCheck *this,Solver *s,PostPropagator *ctx)

{
  uint uVar1;
  bool checkMin;
  bool bVar2;
  UfsType t;
  ulong uVar3;
  
  if ((ctx == (PostPropagator *)0x0) &&
     (uVar3 = (this->mini_).ptr_ & 0xfffffffffffffffe, uVar3 != 0)) {
    uVar1 = (s->levels_).super_type.ebo_.size;
    if (uVar1 < *(uint *)(uVar3 + 0xc)) {
      *(int *)(uVar3 + 0x10) = *(int *)(uVar3 + 0x10) + (uVar1 - *(uint *)(uVar3 + 0xc));
      *(uint *)(uVar3 + 0xc) = uVar1;
    }
    checkMin = *(uint *)(uVar3 + 0x10) == uVar1 || *(uint *)(uVar3 + 0x10) == 0;
  }
  else {
    checkMin = false;
  }
  do {
    t = findUfs(this,s,checkMin);
    if (t == ufs_none) goto LAB_00177a79;
    bVar2 = falsifyUfs(this,t);
  } while (bVar2);
  resetTodo(this);
LAB_00177a79:
  return t == ufs_none;
}

Assistant:

bool DefaultUnfoundedCheck::propagateFixpoint(Solver& s, PostPropagator* ctx) {
	bool checkMin = ctx == 0 && mini_.get() && mini_->partialCheck(s.decisionLevel());
	for (UfsType t; (t = findUfs(s, checkMin)) != ufs_none; ) {
		if (!falsifyUfs(t)) {
			resetTodo();
			return false;
		}
	}
	return true;
}